

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double chicdf(double x,int df)

{
  double dVar1;
  double a;
  double oup;
  int df_local;
  double x_local;
  
  if (df < 1) {
    printf("Degree of freedom is a real positive integer");
    exit(1);
  }
  if (x < 0.0) {
    printf("The range of distribution only takes non-negative and real values");
    exit(1);
  }
  dVar1 = pgamma(x / 2.0,(double)df / 2.0);
  return dVar1;
}

Assistant:

double chicdf(double x, int df) {
	double oup,a;
	if (df <= 0 ) {
		printf("Degree of freedom is a real positive integer");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	a = (double) df;
	oup = pgamma(x/2,a/2);
	return oup;
}